

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::read_entry
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  bool bVar1;
  uint uVar2;
  unique_ptr *this_00;
  pointer pDVar3;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range2;
  PayloadReadFlags flags_local;
  void *blob_local;
  size_t *blob_size_local;
  Hash hash_local;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  if ((this->mode != Append) && (this->mode != OverWrite)) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
    if (bVar1) {
      pDVar3 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->(&this->readonly_interface);
      uVar2 = (*pDVar3->_vptr_DatabaseInterface[3])
                        (pDVar3,(ulong)tag,hash,blob_size,blob,(ulong)flags);
      if ((uVar2 & 1) != 0) {
        return true;
      }
    }
    __end2 = std::
             vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ::begin(&this->extra_readonly);
    extra = (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             *)std::
               vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
               ::end(&this->extra_readonly);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                                       *)&extra), bVar1) {
      this_00 = (unique_ptr *)
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                ::operator*(&__end2);
      bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
      if (bVar1) {
        pDVar3 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)this_00);
        uVar2 = (*pDVar3->_vptr_DatabaseInterface[3])
                          (pDVar3,(ulong)tag,hash,blob_size,blob,(ulong)flags);
        if ((uVar2 & 1) != 0) {
          return true;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if (mode == DatabaseMode::Append || mode == DatabaseMode::OverWrite)
			return false;

		if (readonly_interface && readonly_interface->read_entry(tag, hash, blob_size, blob, flags))
			return true;

		// There shouldn't be that many read-only databases to the point where we need to use hashmaps
		// to map hash/tag to the readonly database.
		for (auto &extra : extra_readonly)
			if (extra && extra->read_entry(tag, hash, blob_size, blob, flags))
				return true;

		return false;
	}